

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

int8_t __thiscall InputStream::readInt8(InputStream *this)

{
  int8_t iVar1;
  undefined8 *in_RDI;
  anon_union_1_2_9473010d conv;
  
  iVar1 = (**(code **)*in_RDI)();
  return iVar1;
}

Assistant:

int8_t InputStream::readInt8() {

  union {
    int8_t i;
    uint8_t u;
  } conv;

  conv.u = readByte();
  return conv.i;
}